

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitRefCast(FunctionValidator *this,RefCast *curr)

{
  bool bVar1;
  BasicHeapType left;
  BasicHeapType right;
  Module *pMVar2;
  bool local_39;
  HeapType local_30;
  HeapType local_28;
  BasicType local_1c;
  RefCast *local_18;
  RefCast *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (RefCast *)this;
  pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  bVar1 = FeatureSet::hasGC(&pMVar2->features);
  shouldBeTrue<wasm::RefCast*>(this,bVar1,local_18,"ref.cast requires gc [--enable-gc]");
  local_1c = unreachable;
  bVar1 = wasm::Type::operator==(&local_18->ref->type,&local_1c);
  if (!bVar1) {
    bVar1 = wasm::Type::isRef(&local_18->ref->type);
    bVar1 = shouldBeTrue<wasm::RefCast*>(this,bVar1,local_18,"ref.cast ref must have ref type");
    if (bVar1) {
      local_28 = wasm::Type::getHeapType
                           (&(local_18->super_SpecificExpression<(wasm::Expression::Id)58>).
                             super_Expression.type);
      left = HeapType::getBottom(&local_28);
      local_30 = wasm::Type::getHeapType(&local_18->ref->type);
      right = HeapType::getBottom(&local_30);
      shouldBeEqual<wasm::RefCast*,wasm::HeapType::BasicHeapType>
                (this,left,right,local_18,
                 "ref.cast target type and ref type must have a common supertype");
      bVar1 = wasm::Type::isNullable(&local_18->ref->type);
      local_39 = true;
      if (!bVar1) {
        local_39 = wasm::Type::isNonNullable
                             (&(local_18->super_SpecificExpression<(wasm::Expression::Id)58>).
                               super_Expression.type);
      }
      shouldBeTrue<wasm::RefCast*>
                (this,local_39,local_18,"ref.cast null of non-nullable references are not allowed");
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitRefCast(RefCast* curr) {
  shouldBeTrue(
    getModule()->features.hasGC(), curr, "ref.cast requires gc [--enable-gc]");
  if (curr->ref->type == Type::unreachable) {
    return;
  }
  if (!shouldBeTrue(
        curr->ref->type.isRef(), curr, "ref.cast ref must have ref type")) {
    return;
  }
  shouldBeEqual(
    curr->type.getHeapType().getBottom(),
    curr->ref->type.getHeapType().getBottom(),
    curr,
    "ref.cast target type and ref type must have a common supertype");

  // We should never have a nullable cast of a non-nullable reference, since
  // that unnecessarily loses type information.
  shouldBeTrue(curr->ref->type.isNullable() || curr->type.isNonNullable(),
               curr,
               "ref.cast null of non-nullable references are not allowed");
}